

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_sext(BtorSimBitVector *bv,uint32_t len)

{
  uint uVar1;
  BtorSimBitVector *a;
  BtorSimBitVector *pBVar2;
  
  uVar1 = bv->width - 1;
  if (((&bv[1].width)[~(uVar1 >> 5) + bv->len] >> (uVar1 & 0x1f) & 1) == 0) {
    a = btorsim_bv_new(len);
  }
  else {
    a = btorsim_bv_ones(len);
  }
  pBVar2 = btorsim_bv_concat(a,bv);
  free(a);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sext (const BtorSimBitVector *bv, uint32_t len)
{
  assert (bv);
  assert (len > 0);

  uint32_t msb;
  BtorSimBitVector *res, *tmp;

  msb = btorsim_bv_get_bit (bv, bv->width - 1);
  tmp = msb ? btorsim_bv_ones (len) : btorsim_bv_zero (len);
  res = btorsim_bv_concat (tmp, bv);
  btorsim_bv_free (tmp);
  assert (rem_bits_zero_dbg (res));
  return res;
}